

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O2

int Mecab_refresh(Mecab *m)

{
  long lVar1;
  
  if (m->feature != (char **)0x0) {
    for (lVar1 = 0; lVar1 < m->size; lVar1 = lVar1 + 1) {
      free(m->feature[lVar1]);
    }
    free(m->feature);
    m->feature = (char **)0x0;
    m->size = 0;
  }
  return 1;
}

Assistant:

BOOL Mecab_refresh(Mecab *m)
{
   int i;

   if(m->feature != NULL) {
      for(i = 0; i < m->size; i++)
         free(m->feature[i]);
      free(m->feature);
      m->feature = NULL;
      m->size = 0;
   }

   return TRUE;
}